

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManComputeOverlap2(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Str_t *p_01;
  int local_28;
  int local_24;
  int Count;
  int i;
  Vec_Str_t *vLabel;
  Vec_Int_t *vVisit;
  Gia_Man_t *p_local;
  
  local_28 = Gia_ManAndNum(p);
  local_28 = -local_28;
  iVar1 = Gia_ManHasMapping(p);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                  ,0x14b,"int Gia_ManComputeOverlap2(Gia_Man_t *)");
  }
  p_00 = Vec_IntAlloc(100);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_StrStart(iVar1);
  for (local_24 = 1; iVar1 = Gia_ManObjNum(p), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Gia_ObjIsLut(p,local_24);
    if (iVar1 != 0) {
      iVar1 = Gia_ManComputeOverlap2One(p,local_24,p_01,p_00);
      local_28 = iVar1 + local_28;
    }
  }
  Vec_StrFree(p_01);
  Vec_IntFree(p_00);
  return local_28;
}

Assistant:

int Gia_ManComputeOverlap2( Gia_Man_t * p )
{
    Vec_Int_t * vVisit;
    Vec_Str_t * vLabel;
    int i, Count = -Gia_ManAndNum(p);
    assert( Gia_ManHasMapping(p) );
    vVisit = Vec_IntAlloc( 100 );
    vLabel = Vec_StrStart( Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, i )
        Count += Gia_ManComputeOverlap2One( p, i, vLabel, vVisit );
    Vec_StrFree( vLabel );
    Vec_IntFree( vVisit );
    return Count;
}